

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_NodalProjector.cpp
# Opt level: O1

void __thiscall
Hydro::NodalProjector::project
          (NodalProjector *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_phi
          ,Real a_rtol,Real a_atol)

{
  pointer pMVar1;
  long lVar2;
  pointer pMVar3;
  long lVar4;
  long lVar5;
  
  if ((long)(a_phi->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(a_phi->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 !=
      ((long)(this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
             super__Vector_impl_data._M_start >> 7) * -0x5555555555555555) {
    amrex::Assert_host("a_phi.size()==m_phi.size()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/Projections/hydro_NodalProjector.cpp"
                       ,0x14e,(char *)0x0);
  }
  pMVar3 = (this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = (this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar1 != pMVar3 && -1 < (long)pMVar1 - (long)pMVar3) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      amrex::MultiFab::Copy
                ((MultiFab *)
                 ((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                         _vptr_FabArrayBase + lVar4),
                 (a_phi->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5],0,0,1,
                 *(int *)((long)(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow
                                .vect + lVar4));
      lVar5 = lVar5 + 1;
      pMVar3 = (this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = ((long)(this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar3 >> 7) * -0x5555555555555555;
      lVar4 = lVar4 + 0x180;
    } while (lVar2 - lVar5 != 0 && lVar5 <= lVar2);
  }
  project(this,a_rtol,a_atol);
  pMVar3 = (this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = (this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar1 != pMVar3 && -1 < (long)pMVar1 - (long)pMVar3) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      amrex::MultiFab::Copy
                ((a_phi->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5],
                 (MultiFab *)
                 ((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                         _vptr_FabArrayBase + lVar4),0,0,1,
                 *(int *)((long)(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow
                                .vect + lVar4));
      lVar5 = lVar5 + 1;
      pMVar3 = (this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = ((long)(this->m_phi).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar3 >> 7) * -0x5555555555555555;
      lVar4 = lVar4 + 0x180;
    } while (lVar2 - lVar5 != 0 && lVar5 <= lVar2);
  }
  return;
}

Assistant:

void
NodalProjector::project ( const Vector<MultiFab*>& a_phi, Real a_rtol, Real a_atol )
{
    AMREX_ALWAYS_ASSERT(a_phi.size()==m_phi.size());

    for (int lev=0; lev < m_phi.size(); ++lev )
    {
        MultiFab::Copy(m_phi[lev],*a_phi[lev],0,0,1,m_phi[lev].nGrow());
    }

    project(a_rtol, a_atol);

    for (int lev=0; lev < m_phi.size(); ++lev )
    {
        MultiFab::Copy(*a_phi[lev],m_phi[lev],0,0,1,m_phi[lev].nGrow());
    }
}